

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
google::protobuf::internal::anon_unknown_36::GenerateFieldNames
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Descriptor *descriptor,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> entries,
          MessageOptions *message_options,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields)

{
  pointer puVar1;
  ushort *puVar2;
  byte bVar3;
  long lVar4;
  size_t sVar5;
  pointer pFVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  pointer __dest;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  allocator_type local_5a;
  value_type_conflict3 local_59;
  ulong local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_50;
  size_t local_48;
  string_view message_name;
  
  pFVar6 = entries.ptr_;
  lVar8 = entries.len_ * 0x18;
  lVar4 = 0;
  for (lVar7 = 0; lVar8 - lVar7 != 0; lVar7 = lVar7 + 0x18) {
    if ((&pFVar6->utf8_check_mode)[lVar7] != kNone) {
      lVar4 = lVar4 + (ulong)**(ushort **)(*(long *)((long)&pFVar6->field + lVar7) + 8);
    }
  }
  if (lVar4 == 0) {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pcVar10 = (descriptor->all_names_).payload_;
    local_48 = (size_t)*(ushort *)(pcVar10 + 2);
    pcVar10 = pcVar10 + ~local_48;
    uVar9 = 0xff;
    if (local_48 < 0xff) {
      uVar9 = local_48;
    }
    local_59 = '\0';
    message_name._M_len = local_48;
    message_name._M_str = pcVar10;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,uVar9 + (entries.len_ & 0xfffffffffffffff8) + lVar4 + 8,
               &local_59,&local_5a);
    sVar5 = local_48;
    puVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *puVar1 = (uchar)uVar9;
    bVar3 = 7;
    lVar7 = 0;
    for (lVar4 = 0; lVar8 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
      if ((&pFVar6->utf8_check_mode)[lVar4] != kNone) {
        puVar1[lVar7 + 1] = **(uchar **)(*(long *)((long)&pFVar6->field + lVar4) + 8);
      }
      bVar3 = bVar3 + 7;
      lVar7 = lVar7 + 1;
    }
    local_58 = (ulong)bVar3;
    __dest = puVar1 + lVar7 + (ulong)(bVar3 & 7) + 1;
    local_50 = __return_storage_ptr__;
    if ((ushort)local_48 < 0x100) {
      if (local_48 != 0) {
        memcpy(__dest,pcVar10,local_48);
        __dest = puVar1 + lVar7 + sVar5 + ((uint)local_58 & 7) + 1;
      }
    }
    else {
      bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&message_name,0,0x7e);
      sVar5 = bVar11._M_len;
      if (sVar5 != 0) {
        memcpy(__dest,bVar11._M_str,sVar5);
        __dest = puVar1 + lVar7 + sVar5 + ((uint)local_58 & 7) + 1;
      }
      __dest[2] = '.';
      __dest[0] = '.';
      __dest[1] = '.';
      bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&message_name,message_name._M_len - 0x7e,0xffffffffffffffff);
      sVar5 = bVar11._M_len;
      __dest = __dest + 3;
      if (sVar5 != 0) {
        memcpy(__dest,bVar11._M_str,sVar5);
        __dest = __dest + sVar5;
      }
    }
    for (lVar4 = 0; __return_storage_ptr__ = local_50, lVar8 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
      if ((&pFVar6->utf8_check_mode)[lVar4] != kNone) {
        puVar2 = *(ushort **)(*(long *)((long)&pFVar6->field + lVar4) + 8);
        uVar9 = (ulong)*puVar2;
        if (uVar9 != 0) {
          memcpy(__dest,(void *)((long)puVar2 + ~uVar9),uVar9);
          __dest = __dest + uVar9;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> GenerateFieldNames(
    const Descriptor* descriptor,
    const absl::Span<const TailCallTableInfo::FieldEntryInfo> entries,
    const TailCallTableInfo::MessageOptions& message_options,
    absl::Span<const TailCallTableInfo::FieldOptions> fields) {
  static constexpr size_t kMaxNameLength = 255;

  size_t field_name_total_size = 0;
  const auto for_each_field_name = [&](auto with_name, auto no_name) {
    for (const auto& entry : entries) {
      // We only need field names for reporting UTF-8 parsing errors, so we only
      // emit them for string fields with Utf8 transform specified.
      if (entry.utf8_check_mode != cpp::Utf8CheckMode::kNone) {
        with_name(absl::string_view(entry.field->name()));
      } else {
        no_name();
      }
    }
  };

  for_each_field_name([&](auto name) { field_name_total_size += name.size(); },
                      [] {});

  // No names needed. Omit the whole table.
  if (field_name_total_size == 0) {
    return {};
  }

  const absl::string_view message_name = descriptor->full_name();
  uint8_t message_name_size =
      static_cast<uint8_t>(std::min(message_name.size(), kMaxNameLength));
  size_t total_byte_size =
      ((/* message */ 1 + /* fields */ entries.size() + /* round up */ 7) &
       ~7) +
      message_name_size + field_name_total_size;

  std::vector<uint8_t> out_vec(total_byte_size, uint8_t{0});
  uint8_t* out_it = out_vec.data();

  // First, we output the size of each string, as an unsigned byte. The first
  // string is the message name.
  int count = 1;
  *out_it++ = message_name_size;
  for_each_field_name(
      [&](auto name) {
        *out_it++ = static_cast<uint8_t>(name.size());
        ++count;
      },
      [&] {
        ++out_it;
        ++count;
      });
  // align to an 8-byte boundary
  out_it += -count & 7;

  const auto append = [&](absl::string_view str) {
    if (!str.empty()) {
      memcpy(out_it, str.data(), str.size());
      out_it += str.size();
    }
  };

  // The message name is stored at the beginning of the string
  if (message_name.size() > kMaxNameLength) {
    static constexpr int kNameHalfLength = (kMaxNameLength - 3) / 2;
    append(message_name.substr(0, kNameHalfLength));
    append("...");
    append(message_name.substr(message_name.size() - kNameHalfLength));
  } else {
    append(message_name);
  }
  // Then we output the actual field names
  for_each_field_name([&](auto name) { append(name); }, [] {});

  return out_vec;
}